

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

MemberIterator __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
FindMember<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name)

{
  long in_RDX;
  
  if ((name->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x54f,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if ((*(byte *)(in_RDX + 0xf) & 4) != 0) {
    DoFindMember<rapidjson::CrtAllocator>(this,name);
    return (MemberIterator)(Pointer)this;
  }
  __assert_fail("name.IsString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x550,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }